

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall XPMP2::Aircraft::SoundStop(Aircraft *this,uint64_t sndId)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  long *in_RDI;
  string *psVar3;
  string local_30 [32];
  undefined8 local_10 [2];
  
  if (gpSndSys != (long *)0x0) {
    local_10[0] = in_RSI;
    (**(code **)(*gpSndSys + 0x28))(gpSndSys,in_RSI);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::remove
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x65),
               (char *)local_10);
    if (((DAT_0047da44 & 1) != 0) && (glob < 1)) {
      uVar1 = *(uint *)(in_RDI + 1);
      psVar3 = local_30;
      (**(code **)(*in_RDI + 0x10))();
      uVar2 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x2e7,"SoundStop",logDEBUG,"Aircraft %08X (%s): Sound id %lu stopped",(ulong)uVar1,
             uVar2,local_10[0],psVar3);
      std::__cxx11::string::~string(local_30);
    }
  }
  return;
}

Assistant:

void Aircraft::SoundStop (uint64_t sndId)
{
    if (!gpSndSys) return;
    gpSndSys->Stop(sndId);
    chnList.remove(sndId);
    LOG_MATCHING(logDEBUG, "Aircraft %08X (%s): Sound id %lu stopped",
                 modeS_id, GetFlightId().c_str(), (unsigned long)sndId);
}